

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtrmr(fitsfile *gfptr,HDUtracker *HDU,int *status)

{
  int iVar1;
  bool bVar2;
  fitsfile *local_e0;
  fitsfile *mfptr;
  char comment [73];
  char keyvalue [71];
  long local_38;
  long nmembers;
  int hdutype;
  int i;
  int *status_local;
  HDUtracker *HDU_local;
  fitsfile *gfptr_local;
  
  local_38 = 0;
  local_e0 = (fitsfile *)0x0;
  if (*status == 0) {
    _hdutype = status;
    status_local = &HDU->nHDU;
    HDU_local = (HDUtracker *)gfptr;
    iVar1 = ffgtnm(gfptr,&local_38,status);
    *_hdutype = iVar1;
    nmembers._4_4_ = (int)local_38;
    while( true ) {
      bVar2 = false;
      if (0 < nmembers._4_4_) {
        bVar2 = *_hdutype == 0;
      }
      if (!bVar2) break;
      iVar1 = ffgmop((fitsfile *)HDU_local,(long)nmembers._4_4_,&local_e0,_hdutype);
      *_hdutype = iVar1;
      if (*_hdutype == 0x156) {
        *_hdutype = 0;
      }
      else if (*_hdutype == 0) {
        iVar1 = fftsad(local_e0,(HDUtracker *)status_local,(int *)0x0,(char *)0x0);
        *_hdutype = iVar1;
        if (*_hdutype == 0x15a) {
          *_hdutype = 0;
          ffclos(local_e0,_hdutype);
        }
        else if (*_hdutype == 0) {
          iVar1 = ffgkys(local_e0,"EXTNAME",comment + 0x48,(char *)&mfptr,_hdutype);
          *_hdutype = iVar1;
          if (*_hdutype == 0xca) {
            *_hdutype = 0;
            comment[0x48] = '\0';
          }
          prepare_keyvalue(comment + 0x48);
          if (*_hdutype == 0) {
            iVar1 = fits_strcasecmp(comment + 0x48,"GROUPING");
            if (iVar1 == 0) {
              iVar1 = ffgtrmr(local_e0,(HDUtracker *)status_local,_hdutype);
              *_hdutype = iVar1;
            }
            iVar1 = ffghdn(local_e0,(int *)&nmembers);
            if (iVar1 == 1) {
              iVar1 = ffgmul(local_e0,1,_hdutype);
              *_hdutype = iVar1;
            }
            else {
              iVar1 = ffgmul(local_e0,0,_hdutype);
              *_hdutype = iVar1;
              iVar1 = ffdhdu(local_e0,(int *)&nmembers,_hdutype);
              *_hdutype = iVar1;
            }
            ffclos(local_e0,_hdutype);
          }
        }
      }
      nmembers._4_4_ = nmembers._4_4_ + -1;
    }
    gfptr_local._4_4_ = *_hdutype;
  }
  else {
    gfptr_local._4_4_ = *status;
  }
  return gfptr_local._4_4_;
}

Assistant:

int ffgtrmr(fitsfile   *gfptr,  /* FITS file pointer to group               */
	    HDUtracker *HDU,    /* list of processed HDUs                   */
	    int        *status) /* return status code                       */
	    
/*
  recursively remove a grouping table and all its members. Each member of
  the grouping table pointed to by gfptr it processed. If the member is itself
  a grouping table then ffgtrmr() is recursively called to process all
  of its members. The HDUtracker struct *HDU is used to make sure a member
  is not processed twice, thus avoiding an infinite loop (e.g., a grouping
  table contains itself as a member).
*/

{
  int i;
  int hdutype;

  long nmembers = 0;

  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];
  
  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  /* get the number of members contained by this grouping table */

  *status = fits_get_num_members(gfptr,&nmembers,status);

  /* loop over all group members and delete them */

  for(i = nmembers; i > 0 && *status == 0; --i)
    {
      /* open the member HDU */

      *status = fits_open_member(gfptr,i,&mfptr,status);

      /* if the member cannot be opened then just skip it and continue */

      if(*status == MEMBER_NOT_FOUND) 
	{
	  *status = 0;
	  continue;
	}

      /* Any other error is a reason to abort */
      
      if(*status != 0) continue;

      /* add the member HDU to the HDUtracker struct */

      *status = fftsad(mfptr,HDU,NULL,NULL);

      /* status == HDU_ALREADY_TRACKED ==> HDU has already been processed */

      if(*status == HDU_ALREADY_TRACKED) 
	{
	  *status = 0;
	  fits_close_file(mfptr,status);
	  continue;
	}
      else if(*status != 0) continue;

      /* determine if the member HDU is itself a grouping table */

      *status = fits_read_key_str(mfptr,"EXTNAME",keyvalue,comment,status);

      /* if no EXTNAME is found then the HDU cannot be a grouping table */ 

      if(*status == KEY_NO_EXIST) 
	{
	  *status     = 0;
	  keyvalue[0] = 0;
	}
      prepare_keyvalue(keyvalue);

      /* Any other error is a reason to abort */
      
      if(*status != 0) continue;

      /* 
	 if the EXTNAME == GROUPING then the member is a grouping table 
	 and we must call ffgtrmr() to process its members
      */

      if(fits_strcasecmp(keyvalue,"GROUPING") == 0)
	  *status = ffgtrmr(mfptr,HDU,status);  

      /* 
	 unlink all the grouping tables that contain this HDU as a member 
	 and then delete the HDU (if not a PHDU)
      */

      if(fits_get_hdu_num(mfptr,&hdutype) == 1)
	      *status = ffgmul(mfptr,1,status);
      else
	  {
	      *status = ffgmul(mfptr,0,status);
	      *status = fits_delete_hdu(mfptr,&hdutype,status);
	  }

      /* close the fitsfile pointer */

      fits_close_file(mfptr,status);
    }

  return(*status);
}